

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O1

int Abc_SclFindBestCell(SC_Man *p,Abc_Obj_t *pObj,Vec_Int_t *vRecalcs,Vec_Int_t *vEvals,int Notches,
                       int DelayGap,float *pGainBest)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Flt_t *pVVar7;
  Abc_Ntk_t *pAVar8;
  void **ppvVar9;
  int *piVar10;
  SC_Pair *pSVar11;
  long lVar12;
  float *pfVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  SC_Cell *pNew;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  int local_5c;
  SC_Cell *local_58;
  
  iVar17 = pObj->Id;
  if (-1 < (long)iVar17) {
    pVVar4 = pObj->pNtk->vGates;
    if (iVar17 < pVVar4->nSize) {
      uVar14 = pVVar4->pArray[iVar17];
      if ((ulong)uVar14 == 0xffffffff) {
        local_58 = (SC_Cell *)0x0;
      }
      else {
        if (((int)uVar14 < 0) ||
           (pvVar5 = pObj->pNtk->pSCLib, *(int *)((long)pvVar5 + 100) <= (int)uVar14)) {
LAB_00473e9f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        local_58 = *(SC_Cell **)(*(long *)((long)pvVar5 + 0x68) + (ulong)uVar14 * 8);
      }
      p->vTimes2->nSize = 0;
      if (0 < vRecalcs->nSize) {
        lVar18 = 0;
        do {
          iVar17 = vRecalcs->pArray[lVar18];
          if (((long)iVar17 < 0) || (pVVar6 = p->pNtk->vObjs, pVVar6->nSize <= iVar17))
          goto LAB_00473e9f;
          pvVar5 = pVVar6->pArray[iVar17];
          if (pvVar5 != (void *)0x0) {
            pVVar7 = p->vTimes2;
            fVar21 = p->pTimes[*(uint *)((long)pvVar5 + 0x10)].rise;
            uVar14 = pVVar7->nCap;
            if (pVVar7->nSize == uVar14) {
              if ((int)uVar14 < 0x10) {
                if (pVVar7->pArray == (float *)0x0) {
                  pfVar13 = (float *)malloc(0x40);
                }
                else {
                  pfVar13 = (float *)realloc(pVVar7->pArray,0x40);
                }
                pVVar7->pArray = pfVar13;
                iVar17 = 0x10;
              }
              else {
                iVar17 = uVar14 * 2;
                if (iVar17 <= (int)uVar14) goto LAB_0047350e;
                if (pVVar7->pArray == (float *)0x0) {
                  pfVar13 = (float *)malloc((ulong)uVar14 << 3);
                }
                else {
                  pfVar13 = (float *)realloc(pVVar7->pArray,(ulong)uVar14 << 3);
                }
                pVVar7->pArray = pfVar13;
              }
              pVVar7->nCap = iVar17;
            }
LAB_0047350e:
            iVar17 = pVVar7->nSize;
            pVVar7->nSize = iVar17 + 1;
            pVVar7->pArray[iVar17] = fVar21;
            pVVar7 = p->vTimes2;
            fVar21 = p->pTimes[*(uint *)((long)pvVar5 + 0x10)].fall;
            uVar14 = pVVar7->nCap;
            if (pVVar7->nSize == uVar14) {
              if ((int)uVar14 < 0x10) {
                if (pVVar7->pArray == (float *)0x0) {
                  pfVar13 = (float *)malloc(0x40);
                }
                else {
                  pfVar13 = (float *)realloc(pVVar7->pArray,0x40);
                }
                pVVar7->pArray = pfVar13;
                iVar17 = 0x10;
              }
              else {
                iVar17 = uVar14 * 2;
                if (iVar17 <= (int)uVar14) goto LAB_004735b5;
                if (pVVar7->pArray == (float *)0x0) {
                  pfVar13 = (float *)malloc((ulong)uVar14 << 3);
                }
                else {
                  pfVar13 = (float *)realloc(pVVar7->pArray,(ulong)uVar14 << 3);
                }
                pVVar7->pArray = pfVar13;
              }
              pVVar7->nCap = iVar17;
            }
LAB_004735b5:
            iVar17 = pVVar7->nSize;
            pVVar7->nSize = iVar17 + 1;
            pVVar7->pArray[iVar17] = fVar21;
            pVVar7 = p->vTimes2;
            fVar21 = p->pSlews[*(uint *)((long)pvVar5 + 0x10)].rise;
            uVar14 = pVVar7->nCap;
            if (pVVar7->nSize == uVar14) {
              if ((int)uVar14 < 0x10) {
                if (pVVar7->pArray == (float *)0x0) {
                  pfVar13 = (float *)malloc(0x40);
                }
                else {
                  pfVar13 = (float *)realloc(pVVar7->pArray,0x40);
                }
                pVVar7->pArray = pfVar13;
                iVar17 = 0x10;
              }
              else {
                iVar17 = uVar14 * 2;
                if (iVar17 <= (int)uVar14) goto LAB_0047365b;
                if (pVVar7->pArray == (float *)0x0) {
                  pfVar13 = (float *)malloc((ulong)uVar14 << 3);
                }
                else {
                  pfVar13 = (float *)realloc(pVVar7->pArray,(ulong)uVar14 << 3);
                }
                pVVar7->pArray = pfVar13;
              }
              pVVar7->nCap = iVar17;
            }
LAB_0047365b:
            iVar17 = pVVar7->nSize;
            pVVar7->nSize = iVar17 + 1;
            pVVar7->pArray[iVar17] = fVar21;
            pVVar7 = p->vTimes2;
            fVar21 = p->pSlews[*(uint *)((long)pvVar5 + 0x10)].fall;
            uVar14 = pVVar7->nCap;
            if (pVVar7->nSize == uVar14) {
              if ((int)uVar14 < 0x10) {
                if (pVVar7->pArray == (float *)0x0) {
                  pfVar13 = (float *)malloc(0x40);
                }
                else {
                  pfVar13 = (float *)realloc(pVVar7->pArray,0x40);
                }
                pVVar7->pArray = pfVar13;
                iVar17 = 0x10;
              }
              else {
                iVar17 = uVar14 * 2;
                if (iVar17 <= (int)uVar14) goto LAB_00473702;
                if (pVVar7->pArray == (float *)0x0) {
                  pfVar13 = (float *)malloc((ulong)uVar14 << 3);
                }
                else {
                  pfVar13 = (float *)realloc(pVVar7->pArray,(ulong)uVar14 << 3);
                }
                pVVar7->pArray = pfVar13;
              }
              pVVar7->nCap = iVar17;
            }
LAB_00473702:
            iVar17 = pVVar7->nSize;
            pVVar7->nSize = iVar17 + 1;
            pVVar7->pArray[iVar17] = fVar21;
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < vRecalcs->nSize);
      }
      p->vTimes3->nSize = 0;
      if (0 < vEvals->nSize) {
        lVar18 = 0;
        do {
          iVar17 = vEvals->pArray[lVar18];
          if (((long)iVar17 < 0) || (pVVar6 = p->pNtk->vObjs, pVVar6->nSize <= iVar17))
          goto LAB_00473e9f;
          pvVar5 = pVVar6->pArray[iVar17];
          if (pvVar5 != (void *)0x0) {
            pVVar7 = p->vTimes3;
            fVar21 = p->pTimes[*(uint *)((long)pvVar5 + 0x10)].rise;
            uVar14 = pVVar7->nCap;
            if (pVVar7->nSize == uVar14) {
              if ((int)uVar14 < 0x10) {
                if (pVVar7->pArray == (float *)0x0) {
                  pfVar13 = (float *)malloc(0x40);
                }
                else {
                  pfVar13 = (float *)realloc(pVVar7->pArray,0x40);
                }
                pVVar7->pArray = pfVar13;
                iVar17 = 0x10;
              }
              else {
                iVar17 = uVar14 * 2;
                if (iVar17 <= (int)uVar14) goto LAB_00473818;
                if (pVVar7->pArray == (float *)0x0) {
                  pfVar13 = (float *)malloc((ulong)uVar14 << 3);
                }
                else {
                  pfVar13 = (float *)realloc(pVVar7->pArray,(ulong)uVar14 << 3);
                }
                pVVar7->pArray = pfVar13;
              }
              pVVar7->nCap = iVar17;
            }
LAB_00473818:
            iVar17 = pVVar7->nSize;
            pVVar7->nSize = iVar17 + 1;
            pVVar7->pArray[iVar17] = fVar21;
            pVVar7 = p->vTimes3;
            fVar21 = p->pTimes[*(uint *)((long)pvVar5 + 0x10)].fall;
            uVar14 = pVVar7->nCap;
            if (pVVar7->nSize == uVar14) {
              if ((int)uVar14 < 0x10) {
                if (pVVar7->pArray == (float *)0x0) {
                  pfVar13 = (float *)malloc(0x40);
                }
                else {
                  pfVar13 = (float *)realloc(pVVar7->pArray,0x40);
                }
                pVVar7->pArray = pfVar13;
                iVar17 = 0x10;
              }
              else {
                iVar17 = uVar14 * 2;
                if (iVar17 <= (int)uVar14) goto LAB_004738bf;
                if (pVVar7->pArray == (float *)0x0) {
                  pfVar13 = (float *)malloc((ulong)uVar14 << 3);
                }
                else {
                  pfVar13 = (float *)realloc(pVVar7->pArray,(ulong)uVar14 << 3);
                }
                pVVar7->pArray = pfVar13;
              }
              pVVar7->nCap = iVar17;
            }
LAB_004738bf:
            iVar17 = pVVar7->nSize;
            pVVar7->nSize = iVar17 + 1;
            pVVar7->pArray[iVar17] = fVar21;
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < vEvals->nSize);
      }
      p->vLoads2->nSize = 0;
      if (0 < (pObj->vFanins).nSize) {
        lVar18 = 0;
        do {
          pvVar5 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar18]];
          pVVar7 = p->vLoads2;
          fVar21 = p->pLoads[*(uint *)((long)pvVar5 + 0x10)].rise;
          uVar14 = pVVar7->nCap;
          if (pVVar7->nSize == uVar14) {
            if ((int)uVar14 < 0x10) {
              if (pVVar7->pArray == (float *)0x0) {
                pfVar13 = (float *)malloc(0x40);
              }
              else {
                pfVar13 = (float *)realloc(pVVar7->pArray,0x40);
              }
              pVVar7->pArray = pfVar13;
              iVar17 = 0x10;
            }
            else {
              iVar17 = uVar14 * 2;
              if (iVar17 <= (int)uVar14) goto LAB_004739ad;
              if (pVVar7->pArray == (float *)0x0) {
                pfVar13 = (float *)malloc((ulong)uVar14 << 3);
              }
              else {
                pfVar13 = (float *)realloc(pVVar7->pArray,(ulong)uVar14 << 3);
              }
              pVVar7->pArray = pfVar13;
            }
            pVVar7->nCap = iVar17;
          }
LAB_004739ad:
          iVar17 = pVVar7->nSize;
          pVVar7->nSize = iVar17 + 1;
          pVVar7->pArray[iVar17] = fVar21;
          pVVar7 = p->vLoads2;
          fVar21 = p->pLoads[*(uint *)((long)pvVar5 + 0x10)].fall;
          uVar14 = pVVar7->nCap;
          if (pVVar7->nSize == uVar14) {
            if ((int)uVar14 < 0x10) {
              if (pVVar7->pArray == (float *)0x0) {
                pfVar13 = (float *)malloc(0x40);
              }
              else {
                pfVar13 = (float *)realloc(pVVar7->pArray,0x40);
              }
              pVVar7->pArray = pfVar13;
              iVar17 = 0x10;
            }
            else {
              iVar17 = uVar14 * 2;
              if (iVar17 <= (int)uVar14) goto LAB_00473a54;
              if (pVVar7->pArray == (float *)0x0) {
                pfVar13 = (float *)malloc((ulong)uVar14 << 3);
              }
              else {
                pfVar13 = (float *)realloc(pVVar7->pArray,(ulong)uVar14 << 3);
              }
              pVVar7->pArray = pfVar13;
            }
            pVVar7->nCap = iVar17;
          }
LAB_00473a54:
          iVar17 = pVVar7->nSize;
          pVVar7->nSize = iVar17 + 1;
          pVVar7->pArray[iVar17] = fVar21;
          lVar18 = lVar18 + 1;
        } while (lVar18 < (pObj->vFanins).nSize);
      }
      fVar21 = (float)-DelayGap;
      local_5c = -1;
      iVar17 = 0;
      iVar19 = 0;
      pNew = local_58;
      do {
        if (pNew != local_58) {
          if (Notches < iVar19) break;
          iVar1 = pObj->Id;
          if (((long)iVar1 < 0) || (pVVar4 = pObj->pNtk->vGates, pVVar4->nSize <= iVar1))
          goto LAB_00473ebe;
          pVVar4->pArray[iVar1] = pNew->Id;
          Abc_SclUpdateLoad(p,pObj,local_58,pNew);
          Abc_SclTimeCone(p,vRecalcs);
          iVar1 = pObj->Id;
          if ((long)iVar1 < 0) goto LAB_00473ebe;
          pAVar8 = pObj->pNtk;
          pVVar4 = pAVar8->vGates;
          if (pVVar4->nSize <= iVar1) goto LAB_00473ebe;
          pVVar4->pArray[iVar1] = local_58->Id;
          lVar18 = (long)(pObj->vFanins).nSize;
          if (lVar18 < 1) {
            uVar16 = 0;
          }
          else {
            ppvVar9 = pAVar8->vObjs->pArray;
            piVar10 = (pObj->vFanins).pArray;
            pVVar7 = p->vLoads2;
            uVar14 = pVVar7->nSize;
            uVar15 = 0;
            if (0 < (int)uVar14) {
              uVar15 = uVar14;
            }
            if ((int)uVar14 < 2) {
              uVar14 = 0;
            }
            uVar16 = 0;
            do {
              if ((uVar15 + 1 & 0xfffffffe) == uVar16) goto LAB_00473e80;
              pfVar13 = pVVar7->pArray;
              pSVar11 = p->pLoads;
              uVar2 = *(uint *)((long)ppvVar9[*(int *)((long)piVar10 + uVar16 * 2)] + 0x10);
              pSVar11[uVar2].rise = pfVar13[uVar16];
              if ((uVar14 & 0x7ffffffe) == uVar16) goto LAB_00473e80;
              lVar12 = uVar16 + 1;
              uVar16 = uVar16 + 2;
              pSVar11[uVar2].fall = pfVar13[lVar12];
            } while (lVar18 * 2 != uVar16);
          }
          if (p->vLoads2->nSize != (int)uVar16) {
            __assert_fail("Vec_FltSize(p->vLoads2) == k",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.h"
                          ,0x136,"void Abc_SclLoadRestore(SC_Man *, Abc_Obj_t *)");
          }
          iVar1 = vEvals->nSize;
          if ((long)iVar1 < 1) {
            uVar14 = 0;
            fVar20 = 0.0;
          }
          else {
            pVVar6 = p->pNtk->vObjs;
            fVar20 = 0.0;
            lVar18 = 0;
            uVar14 = 0;
            do {
              iVar3 = vEvals->pArray[lVar18];
              if (((long)iVar3 < 0) || (pVVar6->nSize <= iVar3)) goto LAB_00473e9f;
              pvVar5 = pVVar6->pArray[iVar3];
              if (pvVar5 != (void *)0x0) {
                if ((int)uVar14 < 0) goto LAB_00473e80;
                iVar3 = p->vTimes3->nSize;
                if ((iVar3 <= (int)uVar14) || (uVar15 = uVar14 + 1, iVar3 <= (int)uVar15))
                goto LAB_00473e80;
                pfVar13 = p->vTimes3->pArray;
                uVar16 = (ulong)uVar14;
                uVar14 = uVar14 + 2;
                uVar2 = *(uint *)((long)pvVar5 + 0x10);
                fVar22 = (pfVar13[uVar15] - p->pTimes[uVar2].fall) +
                         (pfVar13[uVar16] - p->pTimes[uVar2].rise);
                fVar20 = (float)(~-(uint)(0.0 < fVar22) & (uint)(fVar22 * 1.5) |
                                (uint)fVar22 & -(uint)(0.0 < fVar22)) * 0.5 + fVar20;
              }
              lVar18 = lVar18 + 1;
            } while (iVar1 != lVar18);
          }
          if (p->vTimes3->nSize != uVar14) {
            __assert_fail("Vec_FltSize(p->vTimes3) == k",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.h"
                          ,0x183,"float Abc_SclEvalPerform(SC_Man *, Vec_Int_t *)");
          }
          if (fVar20 / (float)iVar1 <= fVar21) {
            iVar3 = iVar17 + 1;
            if (iVar17 == 0) {
              iVar3 = iVar17;
            }
          }
          else {
            local_5c = pNew->Id;
            iVar3 = 1;
            fVar21 = fVar20 / (float)iVar1;
          }
          iVar17 = iVar3;
          if (iVar17 == 4) break;
        }
        pNew = pNew->pNext;
        iVar19 = iVar19 + 1;
      } while (pNew != local_58);
      iVar17 = pObj->Id;
      if (((long)iVar17 < 0) || (pVVar4 = pObj->pNtk->vGates, pVVar4->nSize <= iVar17)) {
LAB_00473ebe:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar4->pArray[iVar17] = local_58->Id;
      iVar17 = vRecalcs->nSize;
      if ((long)iVar17 < 1) {
        uVar14 = 0;
      }
      else {
        piVar10 = vRecalcs->pArray;
        pVVar6 = p->pNtk->vObjs;
        lVar18 = 0;
        uVar14 = 0;
        do {
          iVar19 = piVar10[lVar18];
          if (((long)iVar19 < 0) || (pVVar6->nSize <= iVar19)) goto LAB_00473e9f;
          pvVar5 = pVVar6->pArray[iVar19];
          if (pvVar5 != (void *)0x0) {
            if ((int)uVar14 < 0) {
LAB_00473e80:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                            ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
            }
            iVar19 = p->vTimes2->nSize;
            if (iVar19 <= (int)uVar14) goto LAB_00473e80;
            pfVar13 = p->vTimes2->pArray;
            pSVar11 = p->pTimes;
            uVar15 = *(uint *)((long)pvVar5 + 0x10);
            pSVar11[uVar15].rise = pfVar13[uVar14];
            if (iVar19 <= (int)(uVar14 + 1)) goto LAB_00473e80;
            pSVar11[uVar15].fall = pfVar13[uVar14 + 1];
            if (iVar19 <= (int)(uVar14 + 2)) goto LAB_00473e80;
            uVar2 = uVar14 + 3;
            pSVar11 = p->pSlews;
            pSVar11[uVar15].rise = pfVar13[uVar14 + 2];
            if (iVar19 <= (int)uVar2) goto LAB_00473e80;
            uVar14 = uVar14 + 4;
            pSVar11[uVar15].fall = pfVar13[uVar2];
          }
          lVar18 = lVar18 + 1;
        } while (iVar17 != lVar18);
      }
      if (p->vTimes2->nSize != uVar14) {
        __assert_fail("Vec_FltSize(p->vTimes2) == k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.h"
                      ,0x16b,"void Abc_SclConeRestore(SC_Man *, Vec_Int_t *)");
      }
      *pGainBest = fVar21;
      return local_5c;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Abc_SclFindBestCell( SC_Man * p, Abc_Obj_t * pObj, Vec_Int_t * vRecalcs, Vec_Int_t * vEvals, int Notches, int DelayGap, float * pGainBest )
{
    SC_Cell * pCellOld, * pCellNew;
    float dGain, dGainBest;
    int k, gateBest, NoChange = 0;
    // save old gate, timing, fanin load
    pCellOld = Abc_SclObjCell( pObj );
    Abc_SclConeStore( p, vRecalcs );
    Abc_SclEvalStore( p, vEvals );
    Abc_SclLoadStore( p, pObj );
    // try different gate sizes for this node
    gateBest = -1;
    dGainBest = -DelayGap;
    SC_RingForEachCell( pCellOld, pCellNew, k )
    {
        if ( pCellNew == pCellOld )
            continue;
        if ( k > Notches )
            break;
        // set new cell
        Abc_SclObjSetCell( pObj, pCellNew );
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        // recompute timing
        Abc_SclTimeCone( p, vRecalcs );
        // set old cell
        Abc_SclObjSetCell( pObj, pCellOld );
        Abc_SclLoadRestore( p, pObj );
        // save best gain
        dGain = Abc_SclEvalPerform( p, vEvals );
        if ( dGainBest < dGain )
        {
            dGainBest = dGain;
            gateBest = pCellNew->Id;
            NoChange = 1;
        }
        else if ( NoChange )
            NoChange++;
        if ( NoChange == 4 )
            break;
//        printf( "%.2f ", dGain );
    }
//    printf( "Best = %.2f   ", dGainBest );
//    printf( "\n" );
    // put back old cell and timing
    Abc_SclObjSetCell( pObj, pCellOld );
    Abc_SclConeRestore( p, vRecalcs );
    *pGainBest = dGainBest;
    return gateBest;
}